

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O3

bool __thiscall
google::protobuf::compiler::Parser::ParseServiceDefinition
          (Parser *this,ServiceDescriptorProto *service,LocationRecorder *service_location,
          FileDescriptorProto *containing_file)

{
  ArenaStringPtr *this_00;
  bool bVar1;
  string *output;
  Arena *arena;
  LocationRecorder location;
  LocationRecorder LStack_48;
  
  bVar1 = Consume(this,"service");
  if (bVar1) {
    LocationRecorder::Init(&LStack_48,service_location,service_location->source_code_info_);
    LocationRecorder::AddPath(&LStack_48,1);
    LocationRecorder::RecordLegacyLocation(&LStack_48,&service->super_Message,NAME);
    *(byte *)(service->_has_bits_).has_bits_ = (byte)(service->_has_bits_).has_bits_[0] | 1;
    this_00 = &service->name_;
    arena = (Arena *)(service->_internal_metadata_).
                     super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                     .ptr_;
    if (((ulong)arena & 1) != 0) {
      arena = *(Arena **)(((ulong)arena & 0xfffffffffffffffe) + 0x18);
    }
    output = this_00->ptr_;
    if (output == (string *)&internal::fixed_address_empty_string_abi_cxx11_) {
      internal::ArenaStringPtr::CreateInstance
                (this_00,arena,(string *)&internal::fixed_address_empty_string_abi_cxx11_);
      output = this_00->ptr_;
    }
    bVar1 = ConsumeIdentifier(this,output,"Expected service name.");
    LocationRecorder::~LocationRecorder(&LStack_48);
    if (bVar1) {
      bVar1 = ParseServiceBlock(this,service,service_location,containing_file);
      return bVar1;
    }
  }
  return false;
}

Assistant:

bool Parser::ParseServiceDefinition(
    ServiceDescriptorProto* service, const LocationRecorder& service_location,
    const FileDescriptorProto* containing_file) {
  DO(Consume("service"));

  {
    LocationRecorder location(service_location,
                              ServiceDescriptorProto::kNameFieldNumber);
    location.RecordLegacyLocation(service,
                                  DescriptorPool::ErrorCollector::NAME);
    DO(ConsumeIdentifier(service->mutable_name(), "Expected service name."));
  }

  DO(ParseServiceBlock(service, service_location, containing_file));
  return true;
}